

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.hpp
# Opt level: O3

void ws::log_helper<char_const(&)[12]>(Severity severity,FormatWithLoc *fmt,char (*args) [12])

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  time_point time_point_;
  Record rec;
  string local_88;
  Record local_68;
  
  get_logger_instance();
  if (get_logger_instance::instance.mode != none) {
    time_point_.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    Record::Record(&local_68,time_point_,severity,(fmt->loc)._M_impl);
    paVar1 = &local_88.field_2;
    pcVar2 = (fmt->fmt)._M_dataplus._M_p;
    local_88._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar2,pcVar2 + (fmt->fmt)._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (local_88._M_string_length == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_68.message,*args);
    }
    else {
      pcVar2 = (fmt->fmt)._M_dataplus._M_p;
      local_88._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,pcVar2,pcVar2 + (fmt->fmt)._M_string_length);
      Record::add_fmt<char_const(&)[12]>(&local_68,&local_88,args);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    }
    get_logger_instance();
    Logger::add(&get_logger_instance::instance,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.message._M_dataplus._M_p != &local_68.message.field_2) {
      operator_delete(local_68.message._M_dataplus._M_p,
                      local_68.message.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void log_helper(Severity severity, const FormatWithLoc &fmt, Args &&...args)
  {
    if (get_logger_instance().get_mode() == Output::none)
    {
      return;
    }
    Record rec(std::chrono::system_clock::now(), severity, fmt.get_loc());
    if (fmt.get_fmt().empty())
    {
      rec.add(std::forward<Args>(args)...);
    }
    else
    {
      rec.add_fmt(fmt.get_fmt(), std::forward<Args>(args)...);
    }
    get_logger_instance().add(rec);
  }